

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_set_loss(ggml_tensor *tensor)

{
  char *pcVar1;
  int line;
  
  if ((((tensor->ne[0] == 1) && (tensor->ne[1] == 1)) && (tensor->ne[2] == 1)) &&
     (tensor->ne[3] == 1)) {
    if (tensor->type == GGML_TYPE_F32) {
      *(byte *)&tensor->flags = (byte)tensor->flags | 8;
      return;
    }
    pcVar1 = "tensor->type == GGML_TYPE_F32";
    line = 0x18f8;
  }
  else {
    pcVar1 = "ggml_is_scalar(tensor)";
    line = 0x18f7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

void ggml_set_loss(struct ggml_tensor * tensor) {
    GGML_ASSERT(ggml_is_scalar(tensor));
    GGML_ASSERT(tensor->type == GGML_TYPE_F32);
    tensor->flags |= GGML_TENSOR_FLAG_LOSS;
}